

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

BaseNode * __thiscall asmjit::BaseBuilder::addNode(BaseBuilder *this,BaseNode *node)

{
  uint8_t *puVar1;
  BaseNode *pBVar2;
  BaseNode *pBVar3;
  
  if (node == (BaseNode *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/builder.cpp"
               ,0xab,"node");
  }
  if ((node->field_0).field_0._prev != (BaseNode *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/builder.cpp"
               ,0xac,"!node->_prev");
  }
  if ((node->field_0).field_0._next != (BaseNode *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/builder.cpp"
               ,0xad,"!node->_next");
  }
  if ((char)(node->field_1)._any._nodeFlags < '\0') {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/builder.cpp"
               ,0xae,"!node->isActive()");
  }
  pBVar3 = this->_cursor;
  if (pBVar3 == (BaseNode *)0x0) {
    if (this->_firstNode == (BaseNode *)0x0) {
      this->_firstNode = node;
      pBVar3 = (BaseNode *)&this->_lastNode;
    }
    else {
      (node->field_0).field_0._next = this->_firstNode;
      (this->_firstNode->field_0).field_0._prev = node;
      pBVar3 = (BaseNode *)&this->_firstNode;
    }
  }
  else {
    pBVar2 = (pBVar3->field_0).field_0._next;
    (node->field_0).field_0._prev = pBVar3;
    (node->field_0).field_0._next = pBVar2;
    (pBVar3->field_0).field_0._next = node;
    pBVar3 = (BaseNode *)&this->_lastNode;
    if (pBVar2 != (BaseNode *)0x0) {
      pBVar3 = pBVar2;
    }
  }
  (pBVar3->field_0).field_0._prev = node;
  puVar1 = &(node->field_1)._any._nodeFlags;
  *puVar1 = *puVar1 | 0x80;
  if ((node->field_1)._any._nodeType == '\x02') {
    this->_dirtySectionLinks = true;
  }
  this->_cursor = node;
  return node;
}

Assistant:

BaseNode* BaseBuilder::addNode(BaseNode* node) noexcept {
  ASMJIT_ASSERT(node);
  ASMJIT_ASSERT(!node->_prev);
  ASMJIT_ASSERT(!node->_next);
  ASMJIT_ASSERT(!node->isActive());

  if (!_cursor) {
    if (!_firstNode) {
      _firstNode = node;
      _lastNode = node;
    }
    else {
      node->_next = _firstNode;
      _firstNode->_prev = node;
      _firstNode = node;
    }
  }
  else {
    BaseNode* prev = _cursor;
    BaseNode* next = _cursor->next();

    node->_prev = prev;
    node->_next = next;

    prev->_next = node;
    if (next)
      next->_prev = node;
    else
      _lastNode = node;
  }

  node->addFlags(BaseNode::kFlagIsActive);
  if (node->isSection())
    _dirtySectionLinks = true;

  _cursor = node;
  return node;
}